

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void run_container_printf_as_uint32_array(run_container_t *cont,uint32_t base)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  if (cont->n_runs != 0) {
    uVar1 = cont->runs->value;
    uVar2 = cont->runs->length;
    uVar4 = (uint)uVar2;
    printf("%u",(ulong)(uVar1 + base));
    if (uVar2 != 0) {
      uVar3 = base + uVar1;
      do {
        uVar3 = uVar3 + 1;
        printf(",%u",(ulong)uVar3);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    if (1 < cont->n_runs) {
      lVar5 = 1;
      do {
        iVar6 = cont->runs[lVar5].length + 1;
        uVar4 = cont->runs[lVar5].value + base;
        do {
          printf(",%u",(ulong)uVar4);
          uVar4 = uVar4 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        lVar5 = lVar5 + 1;
      } while (lVar5 < cont->n_runs);
    }
  }
  return;
}

Assistant:

void run_container_printf_as_uint32_array(const run_container_t *cont,
                                          uint32_t base) {
    if (cont->n_runs == 0) return;
    {
        uint32_t run_start = base + cont->runs[0].value;
        uint16_t le = cont->runs[0].length;
        printf("%u", run_start);
        for (uint32_t j = 1; j <= le; ++j) printf(",%u", run_start + j);
    }
    for (int32_t i = 1; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;
        for (uint32_t j = 0; j <= le; ++j) printf(",%u", run_start + j);
    }
}